

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

rotations_t *
opengv::relative_pose::fivept_kneip
          (rotations_t *__return_storage_ptr__,RelativeAdapterBase *adapter,
          vector<int,_std::allocator<int>_> *indices)

{
  pointer piVar1;
  pointer piVar2;
  size_t i;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true> local_168;
  Matrix<double,_3,_1,_0,_3,_1> local_138;
  Matrix<double,_3,_5,_0,_3,_5> f2;
  Matrix<double,_3,_5,_0,_3,_5> f1;
  
  piVar1 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar4 = (double *)&f2;
  pdVar5 = (double *)&f1;
  piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar3 = 0; (long)piVar1 - (long)piVar2 >> 2 != lVar3; lVar3 = lVar3 + 1) {
    (*adapter->_vptr_RelativeAdapterBase[2])
              (&local_138,adapter,
               (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar3]);
    local_168.super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_xpr = &f1;
    local_168.super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startRow.m_value
         = 0;
    local_168.super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_outerStride = 3;
    local_168.super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>.m_data = pdVar5
    ;
    local_168.super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startCol.m_value
         = lVar3;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_168,&local_138);
    (*adapter->_vptr_RelativeAdapterBase[3])
              (&local_138,adapter,
               (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar3]);
    local_168.super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_xpr = &f2;
    local_168.super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startRow.m_value
         = 0;
    local_168.super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_outerStride = 3;
    local_168.super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true>,_0>.m_data = pdVar4
    ;
    local_168.super_BlockImpl<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_3,_5,_0,_3,_5>,_3,_1,_true,_true>.m_startCol.m_value
         = lVar3;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,3,5,0,3,5>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_168,&local_138);
    pdVar4 = pdVar4 + 3;
    pdVar5 = pdVar5 + 3;
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  modules::fivept_kneip_main(&f1,&f2,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

opengv::rotations_t
opengv::relative_pose::fivept_kneip(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences == 5);

  Eigen::Matrix<double,3,5> f1;
  Eigen::Matrix<double,3,5> f2;

  for(size_t i = 0; i < numberCorrespondences; i++)
  {
    f1.col(i) = adapter.getBearingVector1(indices[i]);
    f2.col(i) = adapter.getBearingVector2(indices[i]);
  }

  rotations_t rotations;
  modules::fivept_kneip_main( f1, f2, rotations );
  return rotations;
}